

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintGates(Abc_Ntk_t *pNtk,int fUseLibrary)

{
  int iVar1;
  Abc_NtkFunc_t AVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Mio_Gate_t **ppMVar9;
  Abc_Obj_t *pAVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  Mio_Gate_t *pMVar14;
  ulong uVar15;
  int iVar16;
  int i;
  uint uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  int local_54;
  
  AVar2 = pNtk->ntkFunc;
  if (AVar2 == ABC_FUNC_MAP && fUseLibrary != 0) {
    uVar4 = Mio_LibraryReadGateNum((Mio_Library_t *)pNtk->pManFunc);
    ppMVar9 = Mio_LibraryReadGateArray((Mio_Library_t *)pNtk->pManFunc);
    uVar18 = 0;
    uVar15 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar15 = uVar18;
    }
    for (; uVar15 != uVar18; uVar18 = uVar18 + 1) {
      Mio_GateSetValue(ppMVar9[uVar18],0);
    }
    uVar4 = 0;
    for (iVar16 = 0; iVar16 < pNtk->vObjs->nSize; iVar16 = iVar16 + 1) {
      pAVar10 = Abc_NtkObj(pNtk,iVar16);
      if ((((pAVar10 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar10->field_0x14 & 0xf) == 7)) &&
          (iVar5 = Abc_ObjIsBarBuf(pAVar10), iVar16 != 0)) && (iVar5 == 0)) {
        pMVar14 = (Mio_Gate_t *)(pAVar10->field_5).pData;
        iVar5 = Mio_GateReadValue(pMVar14);
        Mio_GateSetValue(pMVar14,iVar5 + 1);
        uVar4 = uVar4 + 1;
        pAVar10 = Abc_NtkFetchTwinNode(pAVar10);
        iVar16 = (iVar16 + 1) - (uint)(pAVar10 == (Abc_Obj_t *)0x0);
      }
    }
    uVar17 = 5;
    for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
      iVar16 = Mio_GateReadValue(ppMVar9[uVar18]);
      uVar6 = uVar17;
      if (iVar16 != 0) {
        pcVar11 = Mio_GateReadName(ppMVar9[uVar18]);
        sVar12 = strlen(pcVar11);
        uVar6 = (uint)sVar12;
        if ((int)(uint)sVar12 < (int)uVar17) {
          uVar6 = uVar17;
        }
      }
      uVar17 = uVar6;
    }
    dVar19 = Abc_NtkGetMappedArea(pNtk);
    for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
      uVar6 = Mio_GateReadValue(ppMVar9[uVar18]);
      if (uVar6 != 0) {
        dVar20 = Mio_GateReadArea(ppMVar9[uVar18]);
        pcVar11 = Mio_GateReadName(ppMVar9[uVar18]);
        uVar7 = Mio_GateReadPinNum(ppMVar9[uVar18]);
        pcVar13 = Mio_GateReadForm(ppMVar9[uVar18]);
        printf("%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%    %s\n",
               dVar20 * (double)(int)uVar6,(dVar20 * (double)(int)uVar6 * 100.0) / dVar19,
               (ulong)uVar17,pcVar11,(ulong)uVar7,(ulong)uVar6,pcVar13);
      }
    }
    printf("%-*s                Instance = %8d   Area = %10.2f   %6.2f %%\n",dVar19,
           0x4059000000000000,(ulong)uVar17,"TOTAL",(ulong)uVar4);
    return;
  }
  bVar3 = true;
  if (AVar2 == ABC_FUNC_BDD) {
    if (pNtk->ntkType == ABC_NTK_LOGIC) {
      iVar16 = Abc_NtkBddToSop(pNtk,-1,1000000000);
      if (iVar16 == 0) {
        puts("Abc_NtkPrintGates(): Converting to SOPs has failed.");
        return;
      }
      bVar3 = false;
    }
  }
  else if ((AVar2 == ABC_FUNC_AIG) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    return;
  }
  iVar16 = 0;
  iVar5 = 0;
  iVar1 = 0;
  local_54 = 0;
  uVar4 = 0;
  uVar17 = 0;
  uVar6 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pAVar10 = Abc_NtkObj(pNtk,i);
    if (((pAVar10 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar10->field_0x14 & 0xf) == 7)) &&
       ((iVar8 = Abc_ObjIsBarBuf(pAVar10), i != 0 && (iVar8 == 0)))) {
      pMVar14 = *(Mio_Gate_t **)&(pAVar10->field_5).iData;
      if (pNtk->ntkFunc == ABC_FUNC_MAP) {
        pMVar14 = (Mio_Gate_t *)Mio_GateReadSop(pMVar14);
      }
      iVar8 = Abc_SopIsConst0((char *)pMVar14);
      if ((iVar8 == 0) && (iVar8 = Abc_SopIsConst1((char *)pMVar14), iVar8 == 0)) {
        iVar8 = Abc_SopIsBuf((char *)pMVar14);
        if (iVar8 == 0) {
          iVar8 = Abc_SopIsInv((char *)pMVar14);
          if (iVar8 == 0) {
            iVar8 = Abc_SopIsComplement((char *)pMVar14);
            if (((iVar8 == 0) && (iVar8 = Abc_SopIsAndType((char *)pMVar14), iVar8 != 0)) ||
               ((iVar8 = Abc_SopIsComplement((char *)pMVar14), iVar8 != 0 &&
                (iVar8 = Abc_SopIsOrType((char *)pMVar14), iVar8 != 0)))) {
              iVar5 = iVar5 + 1;
            }
            else {
              iVar8 = Abc_SopIsComplement((char *)pMVar14);
              if (((iVar8 == 0) || (iVar8 = Abc_SopIsAndType((char *)pMVar14), iVar8 == 0)) &&
                 ((iVar8 = Abc_SopIsComplement((char *)pMVar14), iVar8 != 0 ||
                  (iVar8 = Abc_SopIsOrType((char *)pMVar14), iVar8 == 0)))) {
                local_54 = local_54 + 1;
              }
              else {
                iVar1 = iVar1 + 1;
              }
            }
          }
          else {
            iVar16 = iVar16 + 1;
          }
        }
        else {
          uVar17 = uVar17 + 1;
        }
      }
      else {
        uVar6 = uVar6 + 1;
      }
      uVar4 = uVar4 + 1;
    }
  }
  dVar19 = (double)(int)uVar4;
  printf("Const        = %8d    %6.2f %%\n",((double)(int)uVar6 * 100.0) / dVar19,(ulong)uVar6);
  printf("Buffer       = %8d    %6.2f %%\n",((double)(int)uVar17 * 100.0) / dVar19,(ulong)uVar17);
  printf("Inverter     = %8d    %6.2f %%\n",((double)iVar16 * 100.0) / dVar19);
  printf("And          = %8d    %6.2f %%\n",((double)iVar5 * 100.0) / dVar19);
  printf("Or           = %8d    %6.2f %%\n",((double)iVar1 * 100.0) / dVar19);
  printf("Other        = %8d    %6.2f %%\n",((double)local_54 * 100.0) / dVar19);
  printf("TOTAL        = %8d    %6.2f %%\n",(dVar19 * 100.0) / dVar19,(ulong)uVar4);
  if (bVar3) {
    return;
  }
  Abc_NtkSopToBdd(pNtk);
  return;
}

Assistant:

void Abc_NtkPrintGates( Abc_Ntk_t * pNtk, int fUseLibrary )
{
    Abc_Obj_t * pObj;
    int fHasBdds, i;
    int CountConst, CountBuf, CountInv, CountAnd, CountOr, CountOther, CounterTotal;
    char * pSop;

    if ( fUseLibrary && Abc_NtkHasMapping(pNtk) )
    {
        Mio_Gate_t ** ppGates;
        double Area, AreaTotal;
        int Counter, nGates, i, nGateNameLen;

        // clean value of all gates
        nGates = Mio_LibraryReadGateNum( (Mio_Library_t *)pNtk->pManFunc );
        ppGates = Mio_LibraryReadGateArray( (Mio_Library_t *)pNtk->pManFunc );
        for ( i = 0; i < nGates; i++ )
            Mio_GateSetValue( ppGates[i], 0 );

        // count the gates by name
        CounterTotal = 0;
        Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
        {
            if ( i == 0 ) continue;
            Mio_GateSetValue( (Mio_Gate_t *)pObj->pData, 1 + Mio_GateReadValue((Mio_Gate_t *)pObj->pData) );
            CounterTotal++;
            // assuming that twin gates follow each other
            if ( Abc_NtkFetchTwinNode(pObj) )
                i++;
        }

        // determine the longest gate name
        nGateNameLen = 5;
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            nGateNameLen = Abc_MaxInt( nGateNameLen, strlen(Mio_GateReadName(ppGates[i])) );
        }

        // print the gates
        AreaTotal = Abc_NtkGetMappedArea(pNtk);
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            Area = Counter * Mio_GateReadArea( ppGates[i] );
            printf( "%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%    %s\n",
                nGateNameLen, Mio_GateReadName( ppGates[i] ),
                Mio_GateReadPinNum( ppGates[i] ),
                Counter, Area, 100.0 * Area / AreaTotal,
                Mio_GateReadForm(ppGates[i]) );
        }
        printf( "%-*s                Instance = %8d   Area = %10.2f   %6.2f %%\n",
            nGateNameLen, "TOTAL",
            CounterTotal, AreaTotal, 100.0 );
        return;
    }

    if ( Abc_NtkIsAigLogic(pNtk) )
        return;

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Abc_NtkPrintGates(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // get hold of the SOP of the node
    CountConst = CountBuf = CountInv = CountAnd = CountOr = CountOther = CounterTotal = 0;
    Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        if ( Abc_NtkHasMapping(pNtk) )
            pSop = Mio_GateReadSop((Mio_Gate_t *)pObj->pData);
        else
            pSop = (char *)pObj->pData;
        // collect the stats
        if ( Abc_SopIsConst0(pSop) || Abc_SopIsConst1(pSop) )
            CountConst++;
        else if ( Abc_SopIsBuf(pSop) )
            CountBuf++;
        else if ( Abc_SopIsInv(pSop) )
            CountInv++;
        else if ( (!Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  ( Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountAnd++;
        else if ( ( Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  (!Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountOr++;
        else
            CountOther++;
        CounterTotal++;
    }
    printf( "Const        = %8d    %6.2f %%\n", CountConst  ,  100.0 * CountConst   / CounterTotal );
    printf( "Buffer       = %8d    %6.2f %%\n", CountBuf    ,  100.0 * CountBuf     / CounterTotal );
    printf( "Inverter     = %8d    %6.2f %%\n", CountInv    ,  100.0 * CountInv     / CounterTotal );
    printf( "And          = %8d    %6.2f %%\n", CountAnd    ,  100.0 * CountAnd     / CounterTotal );
    printf( "Or           = %8d    %6.2f %%\n", CountOr     ,  100.0 * CountOr      / CounterTotal );
    printf( "Other        = %8d    %6.2f %%\n", CountOther  ,  100.0 * CountOther   / CounterTotal );
    printf( "TOTAL        = %8d    %6.2f %%\n", CounterTotal,  100.0 * CounterTotal / CounterTotal );

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}